

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# obj-init.c
# Opt level: O3

parser_error parse_artifact_act(parser *p)

{
  int iVar1;
  parser_error pVar2;
  void *pvVar3;
  char *__s2;
  object_kind *poVar4;
  activation *paVar5;
  
  pvVar3 = parser_priv(p);
  __s2 = parser_getstr(p,"name");
  if (pvVar3 == (void *)0x0) {
    pVar2 = PARSE_ERROR_MISSING_RECORD_HEADER;
  }
  else {
    poVar4 = lookup_kind(*(wchar_t *)((long)pvVar3 + 0x20),*(wchar_t *)((long)pvVar3 + 0x24));
    if ((*(int *)((long)pvVar3 + 0x20) == 0x13) && ((uint)z_info->ordinary_kind_max <= poVar4->kidx)
       ) {
      paVar5 = activations + 1;
      do {
        iVar1 = strcmp(paVar5->name,__s2);
        if (iVar1 == 0) goto LAB_00188c84;
        paVar5 = paVar5->next;
      } while (paVar5 != (activation *)0x0);
      paVar5 = (activation *)0x0;
LAB_00188c84:
      poVar4->activation = paVar5;
    }
    else {
      paVar5 = activations + 1;
      do {
        iVar1 = strcmp(paVar5->name,__s2);
        if (iVar1 == 0) goto LAB_00188c4b;
        paVar5 = paVar5->next;
      } while (paVar5 != (activation *)0x0);
      paVar5 = (activation *)0x0;
LAB_00188c4b:
      *(activation **)((long)pvVar3 + 0x120) = paVar5;
    }
    pVar2 = PARSE_ERROR_NONE;
  }
  return pVar2;
}

Assistant:

static enum parser_error parse_artifact_act(struct parser *p) {
	struct artifact *a = parser_priv(p);
	struct object_kind *k;
	const char *name = parser_getstr(p, "name");

	if (!a) {
		return PARSE_ERROR_MISSING_RECORD_HEADER;
	}
	/* Special light activations are a property of the base object */
	k = lookup_kind(a->tval, a->sval);
	if ((a->tval == TV_LIGHT) && (k->kidx >= z_info->ordinary_kind_max)) {
		k->activation = findact(name);
	} else {
		a->activation = findact(name);
	}
	return PARSE_ERROR_NONE;
}